

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::TileParameter::Clear(TileParameter *this)

{
  if (((this->_has_bits_).has_bits_[0] & 3) != 0) {
    this->tiles_ = 0;
    this->axis_ = 1;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  return;
}

Assistant:

void TileParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.TileParameter)
  if (_has_bits_[0 / 32] & 3u) {
    tiles_ = 0;
    axis_ = 1;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}